

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void lys_extension_instances_free(ly_ctx *ctx,lys_ext_instance **e,uint size)

{
  char **ppcVar1;
  LY_STMT stmt;
  lyext_plugin *plVar2;
  long lVar3;
  lys_node *plVar4;
  lys_restr *restr;
  lys_when *w;
  lys_iffeature *iffeature;
  lys_type *type;
  lys_node *node;
  lys_tpdf *plVar5;
  lys_ext *plVar6;
  char *pcVar7;
  undefined8 *puVar8;
  long *plVar9;
  uint uVar10;
  lys_tpdf *tpdf;
  lys_ext_instance *plVar11;
  ulong uVar12;
  ulong uVar13;
  lys_tpdf *plVar14;
  lyext_substmt *local_58;
  ulong local_50;
  lys_ext *local_48;
  ulong local_40;
  lys_ext_instance **local_38;
  
  if ((e == (lys_ext_instance **)0x0 || size == 0) || (*e == (lys_ext_instance *)0x0)) {
    return;
  }
  uVar13 = (ulong)size;
  uVar12 = 0;
  local_50 = uVar13;
  local_38 = e;
LAB_00154e98:
  plVar11 = e[uVar12];
  if (plVar11 != (lys_ext_instance *)0x0) {
    if ((plVar11->flags & 1) == 0) {
      if ((plVar11->flags & 2) != 0) {
        free(plVar11->def);
        e[uVar12]->def = (lys_ext *)0x0;
        yang_free_ext_data((yang_ext_substmt *)e[uVar12]->parent);
        plVar11 = e[uVar12];
      }
      lys_extension_instances_free(ctx,plVar11->ext,(uint)plVar11->ext_size);
      lydict_remove(ctx,e[uVar12]->arg_value);
      plVar11 = e[uVar12];
    }
    if (((plVar11->def != (lys_ext *)0x0) &&
        (plVar2 = plVar11->def->plugin, plVar2 != (lyext_plugin *)0x0)) &&
       (plVar2->type == LYEXT_COMPLEX)) {
      local_48 = plVar11[1].def;
      uVar10 = 0;
      local_40 = uVar12;
      do {
        plVar6 = local_48;
        uVar12 = (ulong)uVar10;
        stmt = *(LY_STMT *)(local_48->padding + uVar12 * 0x18 + -0x1b);
        switch(stmt) {
        case LY_STMT_UNKNOWN:
          goto switchD_001554fa_caseD_0;
        case LY_STMT_ARGUMENT:
        case LY_STMT_BASE:
        case LY_STMT_BELONGSTO:
        case LY_STMT_CONTACT:
        case LY_STMT_DEFAULT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERRTAG:
        case LY_STMT_ERRMSG:
        case LY_STMT_KEY:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PATH:
        case LY_STMT_PREFIX:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_REVISIONDATE:
        case LY_STMT_UNITS:
          puVar8 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (stmt,(lys_ext_instance_complex *)local_38[local_40],&local_58);
          if ((puVar8 != (undefined8 *)0x0) && (plVar9 = (long *)*puVar8, plVar9 != (long *)0x0)) {
            if (LY_STMT_CARD_MAND < local_58->cardinality) {
              pcVar7 = (char *)*plVar9;
              if (pcVar7 != (char *)0x0) {
                do {
                  plVar9 = plVar9 + 1;
                  lydict_remove(ctx,pcVar7);
                  pcVar7 = (char *)*plVar9;
                } while (pcVar7 != (char *)0x0);
                plVar9 = (long *)*puVar8;
              }
              free(plVar9);
              if (stmt == LY_STMT_ARGUMENT) {
                tpdf = (lys_tpdf *)puVar8[1];
              }
              else {
                if (stmt != LY_STMT_BELONGSTO) break;
                tpdf = (lys_tpdf *)puVar8[1];
                pcVar7 = tpdf->name;
                if (pcVar7 != (char *)0x0) {
                  do {
                    tpdf = (lys_tpdf *)&tpdf->dsc;
                    lydict_remove(ctx,pcVar7);
                    pcVar7 = *(char **)tpdf;
                  } while (pcVar7 != (char *)0x0);
                  tpdf = (lys_tpdf *)puVar8[1];
                }
              }
              goto LAB_001554c9;
            }
            lydict_remove(ctx,(char *)plVar9);
            if (stmt == LY_STMT_BELONGSTO) {
              lydict_remove(ctx,(char *)puVar8[1]);
            }
          }
          break;
        case LY_STMT_VALUE:
        case LY_STMT_MAX:
        case LY_STMT_MIN:
        case LY_STMT_POSITION:
          plVar11 = local_38[local_40];
          lVar3 = *(long *)(local_48->padding + uVar12 * 0x18 + -0x13);
          tpdf = *(lys_tpdf **)((long)&plVar11[1].arg_value + lVar3 + 4);
          if (1 < *(uint *)(local_48->padding + uVar12 * 0x18 + -0xb)) {
            if (tpdf == (lys_tpdf *)0x0) {
              tpdf = (lys_tpdf *)0x0;
            }
            else {
              pcVar7 = tpdf->name;
              if (pcVar7 != (char *)0x0) {
                uVar12 = 1;
                do {
                  free(pcVar7);
                  tpdf = *(lys_tpdf **)((long)&plVar11[1].arg_value + lVar3 + 4);
                  pcVar7 = *(char **)(tpdf->padding + uVar12 * 8 + -0x1c);
                  uVar12 = (ulong)((int)uVar12 + 1);
                } while (pcVar7 != (char *)0x0);
              }
            }
          }
LAB_001554c9:
          free(tpdf);
          break;
        case LY_STMT_DIGITS:
        case LY_STMT_MODULE:
          if (1 < *(uint *)(local_48->padding + uVar12 * 0x18 + -0xb)) {
            tpdf = *(lys_tpdf **)
                    ((long)&local_38[local_40][1].arg_value +
                    *(long *)(local_48->padding + uVar12 * 0x18 + -0x13) + 4);
            goto LAB_001554c9;
          }
          break;
        case LY_STMT_UNIQUE:
          plVar9 = (long *)lys_ext_complex_get_substmt
                                     (LY_STMT_UNIQUE,(lys_ext_instance_complex *)local_38[local_40],
                                      (lyext_substmt **)0x0);
          if ((plVar9 != (long *)0x0) && (tpdf = (lys_tpdf *)*plVar9, tpdf != (lys_tpdf *)0x0)) {
            if (*(uint *)(plVar6->padding + uVar12 * 0x18 + -0xb) < 2) {
              if (*(char *)&tpdf->dsc != '\0') {
                uVar12 = 0;
                do {
                  lydict_remove(ctx,*(char **)(tpdf->name + uVar12 * 8));
                  uVar12 = uVar12 + 1;
                  tpdf = (lys_tpdf *)*plVar9;
                } while (uVar12 < *(byte *)&tpdf->dsc);
              }
              free(tpdf->name);
LAB_001554b4:
              tpdf = (lys_tpdf *)*plVar9;
            }
            else {
              plVar9 = (long *)tpdf->name;
              plVar14 = tpdf;
              while (plVar9 != (long *)0x0) {
                if ((char)plVar9[1] != '\0') {
                  uVar12 = 0;
                  do {
                    lydict_remove(ctx,*(char **)(*plVar9 + uVar12 * 8));
                    uVar12 = uVar12 + 1;
                    plVar9 = (long *)plVar14->name;
                  } while (uVar12 < *(byte *)(plVar9 + 1));
                }
                free((void *)*plVar9);
                free(plVar14->name);
                ppcVar1 = &plVar14->dsc;
                plVar14 = (lys_tpdf *)&plVar14->dsc;
                plVar9 = (long *)*ppcVar1;
              }
            }
            goto LAB_001554c9;
          }
          break;
        case LY_STMT_ACTION:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_GROUPING:
        case LY_STMT_INPUT:
        case LY_STMT_LEAF:
        case LY_STMT_LEAFLIST:
        case LY_STMT_LIST:
        case LY_STMT_NOTIFICATION:
        case LY_STMT_OUTPUT:
        case LY_STMT_USES:
        case LY_STMT_RPC:
          plVar11 = local_38[local_40];
          lVar3 = *(long *)(local_48->padding + uVar12 * 0x18 + -0x13);
          node = *(lys_node **)((long)&plVar11[1].arg_value + lVar3 + 4);
          while (node != (lys_node *)0x0) {
            plVar4 = node->next;
            lys_node_free(node,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
            node = plVar4;
          }
          *(undefined8 *)((long)&plVar11[1].arg_value + lVar3 + 4) = 0;
          break;
        case LY_STMT_TYPEDEF:
          puVar8 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (LY_STMT_TYPEDEF,(lys_ext_instance_complex *)local_38[local_40],
                              (lyext_substmt **)0x0);
          if ((puVar8 != (undefined8 *)0x0) && (tpdf = (lys_tpdf *)*puVar8, tpdf != (lys_tpdf *)0x0)
             ) {
            if (*(uint *)(plVar6->padding + uVar12 * 0x18 + -0xb) < 2) {
              lys_tpdf_free(ctx,tpdf);
LAB_001554c5:
              tpdf = (lys_tpdf *)*puVar8;
            }
            else {
              plVar14 = (lys_tpdf *)tpdf->name;
              plVar5 = tpdf;
              while (plVar14 != (lys_tpdf *)0x0) {
                lys_tpdf_free(ctx,plVar14);
                free(plVar5->name);
                plVar14 = (lys_tpdf *)plVar5->dsc;
                plVar5 = (lys_tpdf *)&plVar5->dsc;
              }
            }
            goto LAB_001554c9;
          }
          break;
        case LY_STMT_TYPE:
          puVar8 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (LY_STMT_TYPE,(lys_ext_instance_complex *)local_38[local_40],
                              (lyext_substmt **)0x0);
          if ((puVar8 != (undefined8 *)0x0) && (tpdf = (lys_tpdf *)*puVar8, tpdf != (lys_tpdf *)0x0)
             ) {
            if (*(uint *)(plVar6->padding + uVar12 * 0x18 + -0xb) < 2) {
              lys_type_free(ctx,(lys_type *)tpdf);
              goto LAB_001554c5;
            }
            type = (lys_type *)tpdf->name;
            plVar14 = tpdf;
            while (type != (lys_type *)0x0) {
              lys_type_free(ctx,type);
              free(plVar14->name);
              type = (lys_type *)plVar14->dsc;
              plVar14 = (lys_tpdf *)&plVar14->dsc;
            }
            goto LAB_001554c9;
          }
          break;
        case LY_STMT_IFFEATURE:
          puVar8 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (LY_STMT_IFFEATURE,(lys_ext_instance_complex *)local_38[local_40],
                              (lyext_substmt **)0x0);
          if ((puVar8 != (undefined8 *)0x0) && (tpdf = (lys_tpdf *)*puVar8, tpdf != (lys_tpdf *)0x0)
             ) {
            if (1 < *(uint *)(plVar6->padding + uVar12 * 0x18 + -0xb)) {
              iffeature = (lys_iffeature *)tpdf->name;
              plVar14 = tpdf;
              while (iffeature != (lys_iffeature *)0x0) {
                plVar14 = (lys_tpdf *)&plVar14->dsc;
                lys_iffeature_free(ctx,iffeature,'\x01');
                iffeature = *(lys_iffeature **)plVar14;
              }
              goto LAB_001554c9;
            }
            lys_iffeature_free(ctx,(lys_iffeature *)tpdf,'\x01');
          }
          break;
        case LY_STMT_LENGTH:
        case LY_STMT_MUST:
        case LY_STMT_PATTERN:
        case LY_STMT_RANGE:
          puVar8 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (stmt,(lys_ext_instance_complex *)local_38[local_40],
                              (lyext_substmt **)0x0);
          if ((puVar8 != (undefined8 *)0x0) && (tpdf = (lys_tpdf *)*puVar8, tpdf != (lys_tpdf *)0x0)
             ) {
            if (*(uint *)(plVar6->padding + uVar12 * 0x18 + -0xb) < 2) {
              lys_restr_free(ctx,(lys_restr *)tpdf);
              goto LAB_001554c5;
            }
            restr = (lys_restr *)tpdf->name;
            plVar14 = tpdf;
            while (restr != (lys_restr *)0x0) {
              lys_restr_free(ctx,restr);
              free(plVar14->name);
              restr = (lys_restr *)plVar14->dsc;
              plVar14 = (lys_tpdf *)&plVar14->dsc;
            }
            goto LAB_001554c9;
          }
          break;
        case LY_STMT_WHEN:
          puVar8 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (LY_STMT_WHEN,(lys_ext_instance_complex *)local_38[local_40],
                              (lyext_substmt **)0x0);
          if ((puVar8 != (undefined8 *)0x0) && (tpdf = (lys_tpdf *)*puVar8, tpdf != (lys_tpdf *)0x0)
             ) {
            if (1 < *(uint *)(plVar6->padding + uVar12 * 0x18 + -0xb)) {
              w = (lys_when *)tpdf->name;
              plVar14 = tpdf;
              while (w != (lys_when *)0x0) {
                plVar14 = (lys_tpdf *)&plVar14->dsc;
                lys_when_free(ctx,w);
                w = *(lys_when **)plVar14;
              }
              goto LAB_001554c9;
            }
            lys_when_free(ctx,(lys_when *)tpdf);
          }
          break;
        case LY_STMT_REVISION:
          plVar9 = (long *)lys_ext_complex_get_substmt
                                     (LY_STMT_REVISION,
                                      (lys_ext_instance_complex *)local_38[local_40],
                                      (lyext_substmt **)0x0);
          if ((plVar9 != (long *)0x0) && (tpdf = (lys_tpdf *)*plVar9, tpdf != (lys_tpdf *)0x0)) {
            if (*(uint *)(plVar6->padding + uVar12 * 0x18 + -0xb) < 2) {
              lydict_remove(ctx,*(char **)&tpdf->flags);
              lydict_remove(ctx,*(char **)(*plVar9 + 0x20));
              lys_extension_instances_free
                        (ctx,*(lys_ext_instance ***)(*plVar9 + 0x10),(uint)*(byte *)(*plVar9 + 0xb))
              ;
              goto LAB_001554b4;
            }
            pcVar7 = tpdf->name;
            plVar14 = tpdf;
            while (pcVar7 != (char *)0x0) {
              lydict_remove(ctx,*(char **)(pcVar7 + 0x18));
              lydict_remove(ctx,*(char **)(plVar14->name + 0x20));
              lys_extension_instances_free
                        (ctx,*(lys_ext_instance ***)(plVar14->name + 0x10),
                         (uint)(byte)plVar14->name[0xb]);
              free(plVar14->name);
              ppcVar1 = &plVar14->dsc;
              plVar14 = (lys_tpdf *)&plVar14->dsc;
              pcVar7 = *ppcVar1;
            }
            goto LAB_001554c9;
          }
        }
        uVar10 = uVar10 + 1;
      } while( true );
    }
    goto LAB_0015550c;
  }
  goto LAB_00155511;
switchD_001554fa_caseD_0:
  plVar11 = local_38[local_40];
  e = local_38;
  uVar12 = local_40;
  uVar13 = local_50;
LAB_0015550c:
  free(plVar11);
LAB_00155511:
  uVar12 = uVar12 + 1;
  if (uVar12 == uVar13) {
    free(e);
    return;
  }
  goto LAB_00154e98;
}

Assistant:

void
lys_extension_instances_free(struct ly_ctx *ctx, struct lys_ext_instance **e, unsigned int size)
{
    unsigned int i, j, k;
    struct lyext_substmt *substmt;
    void **pp, **start;
    struct lys_node *siter, *snext;

#define EXTCOMPLEX_FREE_STRUCT(STMT, TYPE, FUNC, FREE, ARGS...)                               \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)e[i], NULL);    \
    if (!pp || !(*pp)) { break; }                                                             \
    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */                    \
        for (start = pp = *pp; *pp; pp++) {                                                   \
            FUNC(ctx, (TYPE *)(*pp), ##ARGS);                                                 \
            if (FREE) { free(*pp); }                                                          \
        }                                                                                     \
        free(start);                                                                          \
    } else { /* single item */                                                                \
        FUNC(ctx, (TYPE *)(*pp), ##ARGS);                                                     \
        if (FREE) { free(*pp); }                                                              \
    }

    if (!size || !e || !(*e)) {
        return;
    }

    for (i = 0; i < size; i++) {
        if (!e[i]) {
            continue;
        }

        if (e[i]->flags & (LYEXT_OPT_INHERIT)) {
            /* no free, this is just a shadow copy of the original extension instance */
        } else {
            if (e[i]->flags & (LYEXT_OPT_YANG)) {
                free(e[i]->def);     /* remove name of instance extension */
                e[i]->def = NULL;
                yang_free_ext_data((struct yang_ext_substmt *)e[i]->parent); /* remove backup part of yang file */
            }
            lys_extension_instances_free(ctx, e[i]->ext, e[i]->ext_size);
            lydict_remove(ctx, e[i]->arg_value);
        }

        if (e[i]->def && e[i]->def->plugin && e[i]->def->plugin->type == LYEXT_COMPLEX) {
            substmt = ((struct lys_ext_instance_complex *)e[i])->substmt;
            for (j = 0; substmt[j].stmt; j++) {
                switch(substmt[j].stmt) {
                case LY_STMT_DESCRIPTION:
                case LY_STMT_REFERENCE:
                case LY_STMT_UNITS:
                case LY_STMT_ARGUMENT:
                case LY_STMT_DEFAULT:
                case LY_STMT_ERRTAG:
                case LY_STMT_ERRMSG:
                case LY_STMT_PREFIX:
                case LY_STMT_NAMESPACE:
                case LY_STMT_PRESENCE:
                case LY_STMT_REVISIONDATE:
                case LY_STMT_KEY:
                case LY_STMT_BASE:
                case LY_STMT_BELONGSTO:
                case LY_STMT_CONTACT:
                case LY_STMT_ORGANIZATION:
                case LY_STMT_PATH:
                    lys_extcomplex_free_str(ctx, (struct lys_ext_instance_complex *)e[i], substmt[j].stmt);
                    break;
                case LY_STMT_TYPE:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_TYPE, struct lys_type, lys_type_free, 1);
                    break;
                case LY_STMT_TYPEDEF:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_TYPEDEF, struct lys_tpdf, lys_tpdf_free, 1);
                    break;
                case LY_STMT_IFFEATURE:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_IFFEATURE, struct lys_iffeature, lys_iffeature_free, 0, 1);
                    break;
                case LY_STMT_MAX:
                case LY_STMT_MIN:
                case LY_STMT_POSITION:
                case LY_STMT_VALUE:
                    pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME && *pp) {
                        for(k = 0; ((uint32_t**)(*pp))[k]; k++) {
                            free(((uint32_t**)(*pp))[k]);
                        }
                    }
                    free(*pp);
                    break;
                case LY_STMT_DIGITS:
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) {
                        /* free the array */
                        pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                        free(*pp);
                    }
                    break;
                case LY_STMT_MODULE:
                    /* modules are part of the context, so they will be freed there */
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) {
                        /* free the array */
                        pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                        free(*pp);
                    }
                    break;
                case LY_STMT_ACTION:
                case LY_STMT_ANYDATA:
                case LY_STMT_ANYXML:
                case LY_STMT_CASE:
                case LY_STMT_CHOICE:
                case LY_STMT_CONTAINER:
                case LY_STMT_GROUPING:
                case LY_STMT_INPUT:
                case LY_STMT_LEAF:
                case LY_STMT_LEAFLIST:
                case LY_STMT_LIST:
                case LY_STMT_NOTIFICATION:
                case LY_STMT_OUTPUT:
                case LY_STMT_RPC:
                case LY_STMT_USES:
                    pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                    LY_TREE_FOR_SAFE((struct lys_node *)(*pp), snext, siter) {
                        lys_node_free(siter, NULL, 0);
                    }
                    *pp = NULL;
                    break;
                case LY_STMT_UNIQUE:
                    pp = lys_ext_complex_get_substmt(LY_STMT_UNIQUE, (struct lys_ext_instance_complex *)e[i], NULL);
                    if (!pp || !(*pp)) {
                        break;
                    }
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */
                        for (start = pp = *pp; *pp; pp++) {
                            for (k = 0; k < (*(struct lys_unique**)pp)->expr_size; k++) {
                                lydict_remove(ctx, (*(struct lys_unique**)pp)->expr[k]);
                            }
                            free((*(struct lys_unique**)pp)->expr);
                            free(*pp);
                        }
                        free(start);
                    } else { /* single item */
                        for (k = 0; k < (*(struct lys_unique**)pp)->expr_size; k++) {
                            lydict_remove(ctx, (*(struct lys_unique**)pp)->expr[k]);
                        }
                        free((*(struct lys_unique**)pp)->expr);
                        free(*pp);
                    }
                    break;
                case LY_STMT_LENGTH:
                case LY_STMT_MUST:
                case LY_STMT_PATTERN:
                case LY_STMT_RANGE:
                    EXTCOMPLEX_FREE_STRUCT(substmt[j].stmt, struct lys_restr, lys_restr_free, 1);
                    break;
                case LY_STMT_WHEN:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_WHEN, struct lys_when, lys_when_free, 0);
                    break;
                case LY_STMT_REVISION:
                    pp = lys_ext_complex_get_substmt(LY_STMT_REVISION, (struct lys_ext_instance_complex *)e[i], NULL);
                    if (!pp || !(*pp)) {
                        break;
                    }
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */
                        for (start = pp = *pp; *pp; pp++) {
                            lydict_remove(ctx, (*(struct lys_revision**)pp)->dsc);
                            lydict_remove(ctx, (*(struct lys_revision**)pp)->ref);
                            lys_extension_instances_free(ctx, (*(struct lys_revision**)pp)->ext,
                                                         (*(struct lys_revision**)pp)->ext_size);
                            free(*pp);
                        }
                        free(start);
                    } else { /* single item */
                        lydict_remove(ctx, (*(struct lys_revision**)pp)->dsc);
                        lydict_remove(ctx, (*(struct lys_revision**)pp)->ref);
                        lys_extension_instances_free(ctx, (*(struct lys_revision**)pp)->ext,
                                                     (*(struct lys_revision**)pp)->ext_size);
                        free(*pp);
                    }
                    break;
                default:
                    /* nothing to free */
                    break;
                }
            }
        }

        free(e[i]);
    }
    free(e);

#undef EXTCOMPLEX_FREE_STRUCT
}